

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 extraout_EDX_03;
  undefined4 extraout_EDX_04;
  undefined4 extraout_EDX_05;
  undefined4 extraout_EDX_06;
  undefined4 extraout_EDX_07;
  undefined4 extraout_EDX_08;
  undefined4 uVar4;
  uint uVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  Rep *pRVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  sVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar10 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = sVar2 + lVar10 * 2;
  pRVar7 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar7 != (Rep *)0x0) {
    pRVar7 = (Rep *)pRVar7->elements;
  }
  uVar6 = extraout_RDX;
  for (lVar9 = 0; uVar4 = (undefined4)uVar6, lVar10 * 8 != lVar9; lVar9 = lVar9 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      (*(UninterpretedOption **)((long)pRVar7->elements + lVar9 + -8));
    sVar2 = sVar2 + sVar3;
    uVar6 = extraout_RDX_00;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->java_package_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar4 = extraout_EDX;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->java_outer_classname_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar4 = extraout_EDX_00;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->go_package_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar4 = extraout_EDX_01;
    }
    if ((uVar1 & 8) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->objc_class_prefix_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_02;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->csharp_namespace_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_03;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->swift_prefix_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_04;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->php_class_prefix_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_05;
    }
    if ((char)uVar1 < '\0') {
      sVar3 = internal::WireFormatLite::StringSize((this->php_namespace_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_06;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->php_metadata_namespace_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_07;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->ruby_package_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar4 = extraout_EDX_08;
    }
    sVar3 = sVar2 + 3;
    if ((uVar1 >> 0xb & 1) == 0) {
      sVar3 = sVar2;
    }
    sVar3 = sVar3 + (uVar1 >> 9 & 2);
    auVar11._0_4_ = -(uint)((uVar1 & 0x8000) == 0);
    auVar11._4_4_ = -(uint)((uVar1 & 0x4000) == 0);
    auVar11._8_4_ = -(uint)((uVar1 & 0x2000) == 0);
    auVar11._12_4_ = -(uint)((uVar1 & 0x1000) == 0);
    uVar5 = movmskps(uVar4,auVar11);
    sVar2 = sVar3 + 3;
    if ((uVar5 & 8) != 0) {
      sVar2 = sVar3;
    }
    sVar3 = sVar2 + 3;
    if ((uVar5 & 4) != 0) {
      sVar3 = sVar2;
    }
    sVar8 = sVar3 + 3;
    if ((uVar5 & 2) != 0) {
      sVar8 = sVar3;
    }
    sVar2 = sVar8 + 3;
    if ((uVar5 & 1) != 0) {
      sVar2 = sVar8;
    }
  }
  if ((uVar1 & 0xf0000) != 0) {
    sVar3 = sVar2 + 3;
    if ((uVar1 >> 0x10 & 1) == 0) {
      sVar3 = sVar2;
    }
    sVar8 = sVar3 + 3;
    if ((uVar1 >> 0x11 & 1) == 0) {
      sVar8 = sVar3;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->optimize_for_);
      sVar8 = sVar8 + sVar2 + 1;
    }
    sVar2 = sVar8 + 3;
    if ((uVar1 >> 0x13 & 1) == 0) {
      sVar2 = sVar8;
    }
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar2;
    return sVar2;
  }
  sVar2 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar2,
                     &this->_cached_size_);
  return sVar2;
}

Assistant:

size_t FileOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string java_package = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_java_package());
    }

    // optional string java_outer_classname = 8;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_java_outer_classname());
    }

    // optional string go_package = 11;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_go_package());
    }

    // optional string objc_class_prefix = 36;
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_objc_class_prefix());
    }

    // optional string csharp_namespace = 37;
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_csharp_namespace());
    }

    // optional string swift_prefix = 39;
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_swift_prefix());
    }

    // optional string php_class_prefix = 40;
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_class_prefix());
    }

    // optional string php_namespace = 41;
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_namespace());
    }

  }
  if (cached_has_bits & 0x0000ff00u) {
    // optional string php_metadata_namespace = 44;
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_metadata_namespace());
    }

    // optional string ruby_package = 45;
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_ruby_package());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (cached_has_bits & 0x00000400u) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
    if (cached_has_bits & 0x00000800u) {
      total_size += 2 + 1;
    }

    // optional bool java_string_check_utf8 = 27 [default = false];
    if (cached_has_bits & 0x00001000u) {
      total_size += 2 + 1;
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (cached_has_bits & 0x00002000u) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (cached_has_bits & 0x00004000u) {
      total_size += 2 + 1;
    }

    // optional bool py_generic_services = 18 [default = false];
    if (cached_has_bits & 0x00008000u) {
      total_size += 2 + 1;
    }

  }
  if (cached_has_bits & 0x000f0000u) {
    // optional bool php_generic_services = 42 [default = false];
    if (cached_has_bits & 0x00010000u) {
      total_size += 2 + 1;
    }

    // optional bool deprecated = 23 [default = false];
    if (cached_has_bits & 0x00020000u) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (cached_has_bits & 0x00040000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_optimize_for());
    }

    // optional bool cc_enable_arenas = 31 [default = true];
    if (cached_has_bits & 0x00080000u) {
      total_size += 2 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}